

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

void __thiscall
Diligent::VulkanDynamicHeap::ReleaseMasterBlocks
          (VulkanDynamicHeap *this,RenderDeviceVkImpl *DeviceVkImpl,Uint64 CmdQueueMask)

{
  Uint64 CmdQueueMask_local;
  RenderDeviceVkImpl *DeviceVkImpl_local;
  VulkanDynamicHeap *this_local;
  
  DynamicHeap::MasterBlockListBasedManager::ReleaseMasterBlocks<Diligent::RenderDeviceVkImpl>
            (&this->m_GlobalDynamicMemMgr->super_MasterBlockListBasedManager,&this->m_MasterBlocks,
             DeviceVkImpl,CmdQueueMask);
  std::
  vector<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
  ::clear(&this->m_MasterBlocks);
  this->m_CurrOffset = 0xffffffffffffffff;
  this->m_AvailableSize = 0;
  this->m_CurrUsedSize = 0;
  this->m_CurrAlignedSize = 0;
  this->m_CurrAllocatedSize = 0;
  return;
}

Assistant:

void VulkanDynamicHeap::ReleaseMasterBlocks(RenderDeviceVkImpl& DeviceVkImpl, Uint64 CmdQueueMask)
{
    m_GlobalDynamicMemMgr.ReleaseMasterBlocks(m_MasterBlocks, DeviceVkImpl, CmdQueueMask);
    m_MasterBlocks.clear();

    m_CurrOffset    = InvalidOffset;
    m_AvailableSize = 0;

    m_CurrUsedSize      = 0;
    m_CurrAlignedSize   = 0;
    m_CurrAllocatedSize = 0;
}